

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_ReadInvalidNumericExpr_Test::TestBody(NLReaderTest_ReadInvalidNumericExpr_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  ReadError *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  ReadError *e;
  bool in_stack_000001a7;
  string *in_stack_000001a8;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  char *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  Type in_stack_fffffffffffffe1c;
  AssertionResult *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  undefined1 local_131 [33];
  string local_110 [38];
  byte local_ea;
  undefined1 local_e9 [33];
  AssertionResult local_c8 [3];
  int local_98;
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [38];
  byte local_4a;
  allocator<char> local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,
               (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
               (allocator<char> *)in_stack_fffffffffffffe20);
    std::allocator<char>::~allocator(&local_49);
    local_4a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe30,
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (allocator<char> *)in_stack_fffffffffffffe20);
      ReadNL(in_stack_000001a8,in_stack_000001a7);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffe20,
                 (char (*) [96])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_98 = 2;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_98 != 0) goto LAB_0015bff7;
  }
  else {
LAB_0015bff7:
    testing::Message::Message((Message *)in_stack_fffffffffffffe20);
    testing::AssertionResult::failure_message((AssertionResult *)0x15c013);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
               in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
    testing::Message::~Message((Message *)0x15c070);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15c0c8);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
               (allocator<char> *)in_stack_fffffffffffffe20);
    std::allocator<char>::~allocator((allocator<char> *)local_e9);
    local_ea = 0;
    uVar2 = testing::internal::AlwaysTrue();
    if ((bool)uVar2) {
      in_stack_fffffffffffffe20 = (AssertionResult *)local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe28),
                 (allocator<char> *)in_stack_fffffffffffffe20);
      ReadNL(in_stack_000001a8,in_stack_000001a7);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string((string *)(local_131 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_131);
    }
    if ((local_ea & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffe20,
                 (char (*) [106])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_98 = 3;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string((string *)(local_e9 + 1));
    if (local_98 == 0) goto LAB_0015c571;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe20);
  testing::AssertionResult::failure_message((AssertionResult *)0x15c4ce);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe00);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
  testing::Message::~Message((Message *)0x15c529);
LAB_0015c571:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15c57e);
  return;
}

Assistant:

TEST(NLReaderTest, ReadInvalidNumericExpr) {
  EXPECT_READ_ERROR("C0\nx\n", "(input):18:1: expected expression");
  EXPECT_READ_ERROR("C0\no22\nv1\nn0\n",
        "(input):18:2: expected numeric expression opcode");
}